

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O0

PDFObject * __thiscall PDFObjectParser::ParseNewObject(PDFObjectParser *this)

{
  bool bVar1;
  __type _Var2;
  EPDFObjectType EVar3;
  int iVar4;
  PDFNull *this_00;
  longlong lVar5;
  PDFInteger *this_01;
  undefined8 uVar6;
  ObjectIDType inObjectID;
  unsigned_long inVersion;
  PDFStreamInput *this_02;
  undefined4 extraout_var;
  LongFilePositionType LVar7;
  PDFSymbol *this_03;
  PDFObject *referenceObject;
  string keywordToken;
  bool isReference;
  PDFObject *versionObject;
  undefined1 local_68 [8];
  string numberToken;
  undefined1 local_38 [8];
  string token;
  PDFObject *pdfObject;
  PDFObjectParser *this_local;
  
  token.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = GetNextToken(this,(string *)local_38);
  if (bVar1) {
    bVar1 = IsBoolean(this,(string *)local_38);
    if (bVar1) {
      token.field_2._8_8_ = ParseBoolean(this,(string *)local_38);
    }
    else {
      bVar1 = IsLiteralString(this,(string *)local_38);
      if (bVar1) {
        token.field_2._8_8_ = ParseLiteralString(this,(string *)local_38);
      }
      else {
        bVar1 = IsHexadecimalString(this,(string *)local_38);
        if (bVar1) {
          token.field_2._8_8_ = ParseHexadecimalString(this,(string *)local_38);
        }
        else {
          bVar1 = IsNull(this,(string *)local_38);
          if (bVar1) {
            this_00 = (PDFNull *)operator_new(0x48);
            PDFNull::PDFNull(this_00);
            token.field_2._8_8_ = this_00;
          }
          else {
            bVar1 = IsName(this,(string *)local_38);
            if (bVar1) {
              token.field_2._8_8_ = ParseName(this,(string *)local_38);
            }
            else {
              bVar1 = IsNumber(this,(string *)local_38);
              if (bVar1) {
                token.field_2._8_8_ = ParseNumber(this,(string *)local_38);
                if ((((PDFObject *)token.field_2._8_8_ != (PDFObject *)0x0) &&
                    (EVar3 = PDFObject::GetType((PDFObject *)token.field_2._8_8_),
                    EVar3 == ePDFObjectInteger)) &&
                   (lVar5 = PDFInteger::GetValue((PDFInteger *)token.field_2._8_8_), 0 < lVar5)) {
                  std::__cxx11::string::string((string *)local_68);
                  bVar1 = GetNextToken(this,(string *)local_68);
                  if (bVar1) {
                    bVar1 = IsNumber(this,(string *)local_68);
                    if (bVar1) {
                      this_01 = (PDFInteger *)ParseNumber(this,(string *)local_68);
                      keywordToken.field_2._M_local_buf[0xf] = '\0';
                      if (((this_01 == (PDFInteger *)0x0) ||
                          (EVar3 = PDFObject::GetType((PDFObject *)this_01),
                          EVar3 != ePDFObjectInteger)) ||
                         (lVar5 = PDFInteger::GetValue(this_01), lVar5 < 0)) {
                        SaveTokenToBuffer(this,(string *)local_68);
                      }
                      else {
                        std::__cxx11::string::string((string *)&referenceObject);
                        bVar1 = GetNextToken(this,(string *)&referenceObject);
                        if (bVar1) {
                          bVar1 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&referenceObject,&scR_abi_cxx11_);
                          if (bVar1) {
                            SaveTokenToBuffer(this,(string *)local_68);
                            SaveTokenToBuffer(this,(string *)&referenceObject);
                          }
                          else {
                            keywordToken.field_2._M_local_buf[0xf] = '\x01';
                          }
                        }
                        std::__cxx11::string::~string((string *)&referenceObject);
                      }
                      uVar6 = token.field_2._8_8_;
                      if ((keywordToken.field_2._M_local_buf[0xf] & 1U) != 0) {
                        uVar6 = operator_new(0x58);
                        inObjectID = PDFInteger::GetValue((PDFInteger *)token.field_2._8_8_);
                        inVersion = PDFInteger::GetValue(this_01);
                        PDFIndirectObjectReference::PDFIndirectObjectReference
                                  ((PDFIndirectObjectReference *)uVar6,inObjectID,inVersion);
                        if (token.field_2._8_8_ != 0) {
                          (**(code **)(*(long *)token.field_2._8_8_ + 8))();
                        }
                      }
                      token.field_2._8_8_ = uVar6;
                      if (this_01 != (PDFInteger *)0x0) {
                        (*(this_01->super_PDFObject).super_RefCountObject._vptr_RefCountObject[1])()
                        ;
                      }
                    }
                    else {
                      SaveTokenToBuffer(this,(string *)local_68);
                    }
                  }
                  std::__cxx11::string::~string((string *)local_68);
                }
              }
              else {
                bVar1 = IsArray(this,(string *)local_38);
                if (bVar1) {
                  token.field_2._8_8_ = ParseArray(this);
                }
                else {
                  bVar1 = IsDictionary(this,(string *)local_38);
                  if (bVar1) {
                    token.field_2._8_8_ = ParseDictionary(this);
                    if (((PDFObject *)token.field_2._8_8_ != (PDFObject *)0x0) &&
                       (bVar1 = GetNextToken(this,(string *)local_38), bVar1)) {
                      _Var2 = std::operator==(&scStream_abi_cxx11_,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_38);
                      if (_Var2) {
                        this_02 = (PDFStreamInput *)operator_new(0x58);
                        uVar6 = token.field_2._8_8_;
                        iVar4 = (*this->mCurrentPositionProvider->_vptr_IReadPositionProvider[2])();
                        LVar7 = PDFParserTokenizer::GetReadBufferSize(&this->mTokenizer);
                        PDFStreamInput::PDFStreamInput
                                  (this_02,(PDFDictionary *)uVar6,
                                   CONCAT44(extraout_var,iVar4) - LVar7);
                        token.field_2._8_8_ = this_02;
                      }
                      else {
                        SaveTokenToBuffer(this,(string *)local_38);
                      }
                    }
                  }
                  else {
                    this_03 = (PDFSymbol *)operator_new(0x68);
                    PDFSymbol::PDFSymbol(this_03,(string *)local_38);
                    token.field_2._8_8_ = this_03;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  uVar6 = token.field_2._8_8_;
  std::__cxx11::string::~string((string *)local_38);
  return (PDFObject *)uVar6;
}

Assistant:

PDFObject* PDFObjectParser::ParseNewObject()
{
	PDFObject* pdfObject = NULL;
	std::string token;

	do
	{
		if(!GetNextToken(token))
			break;

		// based on the parsed token, and perhaps some more, determine the type of object
		// and how to parse it.

		// Boolean
		if(IsBoolean(token))
		{
			pdfObject = ParseBoolean(token);
			break;
		} 
		// Literal String
		else if(IsLiteralString(token))
		{
			pdfObject = ParseLiteralString(token);
			break;
		}
		// Hexadecimal String
		else if(IsHexadecimalString(token))
		{
			pdfObject = ParseHexadecimalString(token);
			break;
		}
		// NULL
		else if (IsNull(token))
		{
			pdfObject = new PDFNull();
			break;
		}
		// Name
		else if(IsName(token))
		{
			pdfObject = ParseName(token);
			break;
		}
		// Number (and possibly an indirect reference)
		else if(IsNumber(token))
		{	
			pdfObject = ParseNumber(token);
			
			// this could be an indirect reference in case this is a positive integer
			// and the next one is also, and then there's an "R" keyword
			if(pdfObject && 
				(pdfObject->GetType() == PDFObject::ePDFObjectInteger) && 
				((PDFInteger*)pdfObject)->GetValue() > 0)
			{
				// try parse version
				std::string numberToken;
				if(!GetNextToken(numberToken)) // k. no next token...cant be reference
					break;

				if(!IsNumber(numberToken)) // k. no number, cant be reference
				{
					SaveTokenToBuffer(numberToken);
					break;
				}

				PDFObject* versionObject = ParseNumber(numberToken); 
				bool isReference = false;
				do
				{
					if(!versionObject || 
                       (versionObject->GetType() != PDFObject::ePDFObjectInteger) ||
						((PDFInteger*)versionObject)->GetValue() < 0) // k. failure to parse number, or no non-negative, cant be reference
					{
						SaveTokenToBuffer(numberToken);
						break;
					}

					// try parse R keyword
					std::string keywordToken;
					if(!GetNextToken(keywordToken)) // k. no next token...cant be reference
						break;

					if(keywordToken != scR) // k. not R...cant be reference
					{
						SaveTokenToBuffer(numberToken);
						SaveTokenToBuffer(keywordToken);
						break;
					}

					isReference = true;
				}while(false);

				// if passed all these, then this is a reference
				if(isReference)
				{
					PDFObject* referenceObject = new PDFIndirectObjectReference(
														(ObjectIDType)((PDFInteger*)pdfObject)->GetValue(),
														(unsigned long)((PDFInteger*)versionObject)->GetValue());
					delete pdfObject;
					pdfObject = referenceObject;
				}
				delete versionObject;
			}
			break;
		}
		// Array
		else if(IsArray(token))
		{
			pdfObject = ParseArray();
			break;
		}
		// Dictionary
		else if (IsDictionary(token))
		{
			pdfObject = ParseDictionary();

			if(pdfObject)
			{
				// could be a stream. will be if the next token is the "stream" keyword
				if(!GetNextToken(token))
					break;

				if(scStream == token) 
				{
					// yes, found a stream. record current position as the position where the stream starts. 
					// remove from the current stream position the size of the tokenizer buffer, which is "read", but not used
					pdfObject = new PDFStreamInput((PDFDictionary*)pdfObject, mCurrentPositionProvider->GetCurrentPosition() - mTokenizer.GetReadBufferSize());
				}
				else
				{
					SaveTokenToBuffer(token);
				}
			}

			break;
		}
		// Symbol (legitimate keyword or error. determine if error based on semantics)
		else
			pdfObject = new PDFSymbol(token);
	}while(false);


	return pdfObject;

}